

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O2

void explicit_decl(int level,Item *q)

{
  Symbol *pSVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *__format;
  
  pSVar1 = (q->element).sym;
  uVar4 = pSVar1->usage;
  if (level == 0) {
    if ((uVar4 & 1) != 0) {
      diag("Multiple declaration of ",pSVar1->name);
    }
    uVar4 = uVar4 | 1;
  }
  pSVar1->usage = uVar4 | 8;
  iVar5 = (int)pSVar1->level;
  if (previous_str == (char *)0x0 && iVar5 <= level) {
    __assert_fail("previous_str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/parsact.c"
                  ,0x77,"void explicit_decl(int, Item *)");
  }
  uVar2 = pSVar1->subtype;
  uVar4 = (uint)uVar2;
  if ((~uVar4 & 0x12) == 0) {
    pSVar1->subtype = uVar2 & 0xfffffffffffffffd;
    pcVar6 = pSVar1->name;
    __format = "Notice: %s is promoted from a PARAMETER to a STATE\n";
LAB_0010f14f:
    fprintf(_stderr,__format,pcVar6);
    bVar3 = (byte)previous_subtype & 0x10;
  }
  else {
    if ((~uVar4 & 0x18) == 0) {
      pSVar1->subtype = uVar2 & 0xfffffffffffffff7;
      pcVar6 = pSVar1->name;
      __format = "WARNING: %s is promoted from an ASSIGNED to a STATE\n";
      goto LAB_0010f14f;
    }
    if ((~uVar4 & 10) != 0) {
      if (iVar5 <= level) {
        if (iVar5 < level) {
          (pSVar1->u).str = previous_str;
          return;
        }
        iVar5 = strcmp((pSVar1->u).str,previous_str);
        if (iVar5 == 0) {
          return;
        }
        diag(pSVar1->name," has different values at same level");
      }
      goto LAB_0010f0d8;
    }
    pSVar1->subtype = uVar2 & 0xfffffffffffffffd;
    fprintf(_stderr,"Notice: %s is promoted from a PARAMETER to an ASSIGNED\n",pSVar1->name);
    bVar3 = (byte)previous_subtype & 8;
  }
  if (bVar3 != 0) {
    (pSVar1->u).str = previous_str;
  }
  if (pSVar1->level <= level) {
    return;
  }
LAB_0010f0d8:
  pSVar1->level = (short)level;
  return;
}

Assistant:

void explicit_decl(int level, Item* q)
{
	/* used to be inside parse1.y without the lastvars condition
	   Without the condition it served two purposes.
	   1) variables explicitly declared were so marked so that they
	      would appear first in the .var file.  Unmarked variables
	      appear last.
	   2) Give error message if a variable was explicitly declared
	      more than once.
	   Now, the merge program produces declaration blocks from
	   submodels with a prepended LAST_VARS keyword.  This implies
	   1) that variables in such blocks should appear last (if they
	      don't appear at the top level) and
	   2) multiple declarations are not errors.
	   Hence we merely enclose the old code in an if statement
	   The question arises, on multiple declarations, which value
	   does the .var file get.  In the current implementation it
	   is the last one seen. If this is not right (and a better
	   method would be keep the value declared closest to the root)
	   then it will be the responsibility of merge to delete
	   multiple declarations.
	*/
	/* Solving the multiple declaration problem.
	   merge now gives the level number of the declaration with
	   the root file having level number 0, all its submodels having
	   level number 1, submodels of level 1 submodels having level 2,
	   etc.  The rule is that the lowest level declaration is used.
	   If two declarations exist at the same level then it is an
	   error unless their u.str are identical.  Since, by the time
	   this routine is called the latest declaration has already been
	   installed, each installation routine saves the previous u.str
	   in a static variable. Also a new field is added to the
	   symbol structure to keep track of its level. At this time
	   we retain the EXPLICIT_DECL field for explicit declarations
	   at the root level. The default level when the symbol is
	   allocated is 100. 
	 */
	
	Symbol *sym;

	sym = SYM(q);
	if (!level) { /* No multiple declarations at the root level and
			the symbol is marked explicitly declared */
		if (sym->usage & EXPLICIT_DECL) {
			diag("Multiple declaration of ", sym->name);
		}
		sym->usage |= EXPLICIT_DECL;
	}
	/* this ensures that declared PRIMES will appear in .var file */
	sym->usage |= DEP;

	if (level >= sym->level) {
		assert(previous_str);
	}
	/* resolve possible type conflicts */
	if (type_change(sym, level)) {
		return;
	}
	/* resolve which declaration takes precedence */
	if (level < sym->level) { /* new one takes precedence */
		sym->level = level;
	}else if (level > sym->level) { /* old one takes precedence */
		sym->u.str = previous_str;
	}else if (strcmp(sym->u.str, previous_str) != 0) { /* not identical */
		diag(sym->name, " has different values at same level");
	}
}